

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.cxx
# Opt level: O1

_vector3<float> * __thiscall xray_re::_vector3<float>::decompress(_vector3<float> *this,uint16_t s)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  
  if (initialized == '\0') {
    initialize();
  }
  uVar4 = s >> 7 & 0x3f;
  uVar5 = s & 0x7f;
  uVar2 = uVar4 ^ 0x7f;
  uVar3 = uVar5 ^ 0x7f;
  if (uVar4 + uVar5 < 0x7f) {
    uVar2 = uVar4;
    uVar3 = uVar5;
  }
  fVar1 = *(float *)(uv_adjustment + (ulong)(s & 0x1fff) * 4);
  (this->field_0).field_0.x = (float)uVar2 * fVar1;
  (this->field_0).field_0.y = (float)uVar3 * fVar1;
  fVar6 = (float)(int)(0x7e - (uVar2 + uVar3)) * fVar1;
  (this->field_0).field_0.z = fVar6;
  if ((short)s < 0) {
    (this->field_0).field_0.x = -((float)uVar2 * fVar1);
  }
  if ((s >> 0xe & 1) != 0) {
    (this->field_0).field_0.y = -((float)uVar3 * fVar1);
  }
  if ((s >> 0xd & 1) != 0) {
    (this->field_0).field_0.z = -fVar6;
  }
  return this;
}

Assistant:

_vector3<float>& _vector3<float>::decompress(uint16_t s)
{
	if (!initialized)
		initialize();

	int u = (s >> 7) & 0x3f;
	int v = s & 0x7f;
	if (u + v >= 127) {
		u = 127 - u;
		v = 127 - v;
	}
	float adj = uv_adjustment[s & 0x1fff];
	x = adj * u;
	y = adj * v;
	z = adj * (126 - u - v);
	if (s & 0x8000)
		x = -x;
	if (s & 0x4000)
		y = -y;
	if (s & 0x2000)
		z = -z;
	return *this;
}